

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

float trng::math::detail::GammaP_ser<float,true>(float a,float x)

{
  int in_EDI;
  float in_XMM0_Da;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar1;
  float fVar2;
  double dVar3;
  float in_XMM1_Da;
  int i;
  float sum;
  float n;
  float xx;
  float eps;
  int itmax;
  bool local_25;
  int local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_4;
  
  Catch::clara::std::numeric_limits<float>::epsilon();
  if (4.7683716e-07 <= in_XMM1_Da) {
    local_20 = 1.0 / in_XMM0_Da;
    local_24 = 0;
    local_1c = in_XMM0_Da;
    local_18 = local_20;
    do {
      local_1c = local_1c + 1.0;
      local_24 = local_24 + 1;
      local_18 = (in_XMM1_Da / local_1c) * local_18;
      local_20 = local_18 + local_20;
      Catch::clara::std::abs(in_EDI);
      Catch::clara::std::abs(in_EDI);
      local_25 = extraout_XMM0_Da_00 * 4.7683716e-07 < extraout_XMM0_Da && local_24 < 0x18;
    } while (local_25);
    fVar1 = ln(0.0);
    fVar2 = ln_Gamma(0.0);
    dVar3 = std::exp((double)(ulong)(uint)((in_XMM0_Da * fVar1 + -in_XMM1_Da) - fVar2));
    local_4 = SUB84(dVar3,0) * local_20;
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

TRNG_CUDA_ENABLE T GammaP_ser(T a, T x) {
        const int itmax{numeric_limits<T>::digits};
        const T eps{4 * numeric_limits<T>::epsilon()};
        if (x < eps)
          return T{0};
        T xx{1 / a}, n{a}, sum{xx};
        int i{0};
        do {
          ++n;
          ++i;
          xx *= x / n;
          sum += xx;
        } while (abs(xx) > eps * abs(sum) and i < itmax);
#if __cplusplus >= 201703L
        if constexpr (by_Gamma_a)
#else
        if (by_Gamma_a)
#endif
          return exp(-x + a * ln(x) - ln_Gamma(a)) * sum;
        else
          return exp(-x + a * ln(x)) * sum;
      }